

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_multi_batch_size_helper
              (size_t *n_batches,size_t *n_batch_points,size_t max_n_batch_points,size_t n)

{
  size_t n_local;
  size_t max_n_batch_points_local;
  size_t *n_batch_points_local;
  size_t *n_batches_local;
  undefined4 local_4;
  
  if (max_n_batch_points == 0) {
    local_4 = 0;
  }
  else {
    max_n_batch_points_local = max_n_batch_points;
    if (5000000 < max_n_batch_points) {
      max_n_batch_points_local = 5000000;
    }
    if (n == 0) {
      *n_batches = 0;
      *n_batch_points = 0;
      local_4 = 1;
    }
    else {
      *n_batches = (n - 1) / max_n_batch_points_local + 1;
      *n_batch_points = (n - 1) / *n_batches + 1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_ecmult_multi_batch_size_helper(size_t *n_batches, size_t *n_batch_points, size_t max_n_batch_points, size_t n) {
    if (max_n_batch_points == 0) {
        return 0;
    }
    if (max_n_batch_points > ECMULT_MAX_POINTS_PER_BATCH) {
        max_n_batch_points = ECMULT_MAX_POINTS_PER_BATCH;
    }
    if (n == 0) {
        *n_batches = 0;
        *n_batch_points = 0;
        return 1;
    }
    /* Compute ceil(n/max_n_batch_points) and ceil(n/n_batches) */
    *n_batches = 1 + (n - 1) / max_n_batch_points;
    *n_batch_points = 1 + (n - 1) / *n_batches;
    return 1;
}